

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O1

asn_enc_rval_t *
BOOLEAN_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                  int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ssize_t sVar4;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    if (*sptr == 0) {
      pcVar3 = "<false/>";
      sVar4 = 8;
      sVar2 = 8;
    }
    else {
      pcVar3 = "<true/>";
      sVar4 = 7;
      sVar2 = 7;
    }
    iVar1 = (*cb)(pcVar3,sVar2,app_key);
    if (iVar1 < 0) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
    }
    else {
      __return_storage_ptr__->encoded = sVar4;
      __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
      __return_storage_ptr__->structure_ptr = (void *)0x0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
BOOLEAN_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const BOOLEAN_t *st = (const BOOLEAN_t *)sptr;
	asn_enc_rval_t er;

	(void)ilevel;
	(void)flags;

	if(!st) ASN__ENCODE_FAILED;

	if(*st) {
		ASN__CALLBACK("<true/>", 7);
		er.encoded = 7;
	} else {
		ASN__CALLBACK("<false/>", 8);
		er.encoded = 8;
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}